

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

shared_ptr<pbrt::syntactic::Scene> __thiscall
pbrt::syntactic::Scene::parse(Scene *this,string *fileName,string *basePath)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<pbrt::syntactic::Scene> sVar3;
  shared_ptr<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>_> parser;
  undefined1 local_29;
  BasicParser<pbrt::syntactic::MappedFile> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (BasicParser<pbrt::syntactic::MappedFile> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>,std::allocator<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>>,std::__cxx11::string_const&>
            (&local_20,&local_28,
             (allocator<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>_> *)&local_29,
             basePath);
  BasicParser<pbrt::syntactic::MappedFile>::parse(local_28,fileName);
  this->_vptr_Scene =
       (_func_int **)
       (local_28->scene).super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (local_28->scene).super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->cameras).
  super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1->_M_use_count)->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1->_M_use_count)->_M_pi + 1
      ;
      UNLOCK();
    }
    else {
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1->_M_use_count)->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1->_M_use_count)->_M_pi + 1
      ;
    }
  }
  _Var2._M_pi = extraout_RDX;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<pbrt::syntactic::Scene>)
         sVar3.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Scene> Scene::parse(const std::string &fileName, const std::string &basePath)
    {
      std::shared_ptr<Parser> parser = std::make_shared<Parser>(basePath);
      parser->parse(fileName);
      return parser->getScene();
    }